

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::ContractionsAndExpansions::handlePrefixes
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  UChar *pUVar1;
  UBool UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  UnicodeString *pfx;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  Iterator prefixes;
  UChar *p;
  uint32_t ce32_local;
  UChar32 end_local;
  UChar32 start_local;
  ContractionsAndExpansions *this_local;
  
  pUVar1 = this->data->contexts;
  iVar3 = Collation::indexFromCE32(ce32);
  prefixes.stack_ = (UVector32 *)(pUVar1 + iVar3);
  uVar4 = CollationData::readCE32((UChar *)prefixes.stack_);
  handleCE32(this,start,end,uVar4);
  if (this->addPrefixes != '\0') {
    ConstChar16Ptr::ConstChar16Ptr
              (&local_a8,(char16_t *)((long)&((prefixes.stack_)->super_UObject)._vptr_UObject + 4));
    UCharsTrie::Iterator::Iterator((Iterator *)local_a0,&local_a8,0,&this->errorCode);
    ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
    while (UVar2 = UCharsTrie::Iterator::next((Iterator *)local_a0,&this->errorCode), UVar2 != '\0')
    {
      pfx = UCharsTrie::Iterator::getString((Iterator *)local_a0);
      setPrefix(this,pfx);
      addStrings(this,start,end,this->contractions);
      addStrings(this,start,end,this->expansions);
      uVar4 = UCharsTrie::Iterator::getValue((Iterator *)local_a0);
      handleCE32(this,start,end,uVar4);
    }
    resetPrefix(this);
    UCharsTrie::Iterator::~Iterator((Iterator *)local_a0);
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::handlePrefixes(
        UChar32 start, UChar32 end, uint32_t ce32) {
    const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no prefix match.
    handleCE32(start, end, ce32);
    if(!addPrefixes) { return; }
    UCharsTrie::Iterator prefixes(p + 2, 0, errorCode);
    while(prefixes.next(errorCode)) {
        setPrefix(prefixes.getString());
        // Prefix/pre-context mappings are special kinds of contractions
        // that always yield expansions.
        addStrings(start, end, contractions);
        addStrings(start, end, expansions);
        handleCE32(start, end, (uint32_t)prefixes.getValue());
    }
    resetPrefix();
}